

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codec.h
# Opt level: O0

tuple<int,_int> __thiscall
rest_rpc::rpc_service::msgpack_codec::unpack<std::tuple<int,int>>
          (msgpack_codec *this,char *data,size_t length)

{
  char *in_RCX;
  size_t in_RDX;
  object_handle *in_RSI;
  _Tuple_impl<0UL,_int,_int> in_RDI;
  object *in_stack_ffffffffffffff68;
  object_handle *this_00;
  object_handle *in_stack_ffffffffffffffa0;
  unpack_limit local_50;
  
  this_00 = in_RSI;
  msgpack::v1::unpack_limit::unpack_limit
            (&local_50,0xffffffff,0xffffffff,0xffffffff,0xffffffff,0xffffffff,0xffffffff);
  msgpack::v3::unpack(in_stack_ffffffffffffffa0,in_RCX,in_RDX,(unpack_reference_func)this_00,in_RSI,
                      (unpack_limit *)in_RDI);
  msgpack::v1::object_handle::get(this_00);
  msgpack::v1::object::as<std::tuple<int,int>>(in_stack_ffffffffffffff68);
  return (tuple<int,_int>)in_RDI;
}

Assistant:

T unpack(char const *data, size_t length) {
    try {
      msgpack::unpack(msg_, data, length);
      return msg_.get().as<T>();
    } catch (...) {
      throw std::invalid_argument("unpack failed: Args not match!");
    }
  }